

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cinatra::coro_http_server::
build_part_heads<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,coro_http_server *this,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *ranges,
          string_view mime,string_view file_size_str,size_t *content_len)

{
  pair<int,_int> pVar1;
  uint uVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  pointer ppVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  string __str_1;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  pair<int,_int> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_t *local_60;
  char *local_58;
  size_t local_50;
  pointer local_48;
  size_t local_40;
  char *local_38;
  
  local_38 = mime._M_str;
  local_40 = mime._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar6 = (ranges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_48 = (ranges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != local_48) {
    local_50 = file_size_str._M_len;
    local_58 = file_size_str._M_str;
    local_60 = content_len;
    do {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pVar1 = *ppVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"--","");
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_c8,BOUNDARY_abi_cxx11_,DAT_00357db8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (pbVar4,CRCF_abi_cxx11_,DAT_00357d78);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_c8,"Content-Type: ");
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(pbVar4,local_38,local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (pbVar4,CRCF_abi_cxx11_,DAT_00357d78);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_c8,"Content-Range: ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (pbVar4,"bytes ");
      uVar8 = pVar1.first;
      uVar9 = -uVar8;
      if (0 < (int)uVar8) {
        uVar9 = uVar8;
      }
      uVar7 = 1;
      if (9 < uVar9) {
        uVar5 = (ulong)uVar9;
        uVar2 = 4;
        do {
          uVar7 = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            uVar7 = uVar7 - 2;
            goto LAB_001dab82;
          }
          if (uVar3 < 1000) {
            uVar7 = uVar7 - 1;
            goto LAB_001dab82;
          }
          if (uVar3 < 10000) goto LAB_001dab82;
          uVar5 = uVar5 / 10000;
          uVar2 = uVar7 + 4;
        } while (99999 < uVar3);
        uVar7 = uVar7 + 1;
      }
LAB_001dab82:
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_a8 = pVar1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_80,(ulong)(uVar7 + -((int)uVar8 >> 0x1f)),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_80._M_dataplus._M_p + (uint)-((int)uVar8 >> 0x1f),uVar7,uVar9);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_c8,local_80._M_dataplus._M_p,local_80._M_string_length);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(pbVar4,"-");
      uVar8 = local_a8.second;
      uVar9 = -uVar8;
      if (0 < (int)uVar8) {
        uVar9 = uVar8;
      }
      uVar7 = 1;
      if (9 < uVar9) {
        uVar5 = (ulong)uVar9;
        uVar2 = 4;
        do {
          uVar7 = uVar2;
          uVar3 = (uint)uVar5;
          if (uVar3 < 100) {
            uVar7 = uVar7 - 2;
            goto LAB_001dac43;
          }
          if (uVar3 < 1000) {
            uVar7 = uVar7 - 1;
            goto LAB_001dac43;
          }
          if (uVar3 < 10000) goto LAB_001dac43;
          uVar5 = uVar5 / 10000;
          uVar2 = uVar7 + 4;
        } while (99999 < uVar3);
        uVar7 = uVar7 + 1;
      }
LAB_001dac43:
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_a0,(ulong)(-((int)uVar8 >> 0x1f) + uVar7),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_a0._M_dataplus._M_p + (uint)-((int)uVar8 >> 0x1f),uVar7,uVar9);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(pbVar4,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(pbVar4,"/");
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(pbVar4,local_58,local_50);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (pbVar4,TWO_CRCF_abi_cxx11_,DAT_00357d98);
      content_len = local_60;
      pVar1 = local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      *content_len = *content_len + local_c8._M_string_length;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_c8);
      *content_len = *content_len + (long)(int)((uVar8 - pVar1.first) + 1) + DAT_00357d78;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != local_48);
  }
  *content_len = DAT_00357db8 + *content_len + 4;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> build_part_heads(auto &ranges, std::string_view mime,
                                            std::string_view file_size_str,
                                            size_t &content_len) {
    std::vector<std::string> multi_heads;
    for (auto [start, end] : ranges) {
      std::string part_header = "--";
      part_header.append(BOUNDARY).append(CRCF);
      part_header.append("Content-Type: ").append(mime).append(CRCF);
      part_header.append("Content-Range: ").append("bytes ");
      part_header.append(std::to_string(start))
          .append("-")
          .append(std::to_string(end))
          .append("/")
          .append(file_size_str)
          .append(TWO_CRCF);
      content_len += part_header.size();
      multi_heads.push_back(std::move(part_header));
      size_t part_size = end + 1 - start + CRCF.size();
      content_len += part_size;
    }
    content_len += (BOUNDARY.size() + 4);
    return multi_heads;
  }